

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O1

size_t io::net::
       read<io::basic_string_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>,io::net::transfer_exactly,void>
                 (basic_string_stream<char,_std::char_traits<char>_> *stream,
                 dynamic_vector_buffer<char,_std::allocator<char>_> *b,
                 transfer_exactly completion_condition,error_code *ec)

{
  vector<char,_std::allocator<char>_> *this;
  error_category *peVar1;
  size_t sVar2;
  ulong uVar3;
  size_type __new_size;
  size_t sVar4;
  ulong uVar5;
  mutable_buffers_type buf;
  mutable_buffers_type local_40;
  
  peVar1 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar1;
  uVar3 = b->max_size_ - b->size_;
  if (0xffff < uVar3) {
    uVar3 = 0x10000;
  }
  sVar4 = 0;
  do {
    if (b->max_size_ <= b->size_) {
      return sVar4;
    }
    local_40 = dynamic_vector_buffer<char,_std::allocator<char>_>::prepare(b,uVar3);
    sVar2 = detail::memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
            ::read_some<io::net::mutable_buffer>
                      (&stream->
                        super_memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
                       ,&local_40,ec);
    sVar4 = sVar4 + sVar2;
    uVar5 = completion_condition.exact_ - sVar4;
    if (0xffff < uVar5) {
      uVar5 = 0x10000;
    }
    this = b->vec_;
    if (completion_condition.exact_ <= sVar4) {
      uVar5 = 0;
    }
    uVar3 = (long)(this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)((this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start + b->size_);
    if (sVar2 <= uVar3) {
      uVar3 = sVar2;
    }
    __new_size = uVar3 + b->size_;
    b->size_ = __new_size;
    std::vector<char,_std::allocator<char>_>::resize(this,__new_size);
    if (ec->_M_value != 0) {
      uVar5 = 0;
    }
    uVar3 = b->max_size_ - b->size_;
    if (uVar5 <= uVar3) {
      uVar3 = uVar5;
    }
  } while (uVar3 != 0);
  return sVar4;
}

Assistant:

std::size_t read(SyncReadStream& stream, DynamicBuffer&& b,
                 CompletionCondition completion_condition,
                 std::error_code& ec)
{
    ec.clear();

    std::size_t total_bytes_read = 0;
    const auto calc_next_read_size = [&b](std::size_t cc_return) {
        return std::min(cc_return, b.max_size() - b.size());
    };
    std::size_t next_read_size = calc_next_read_size(max_single_transfer_size);

    while (b.size() < b.max_size()) {
        auto buf = b.prepare(next_read_size);
        std::size_t bytes_read = stream.read_some(buf, ec);
        b.commit(bytes_read);
        total_bytes_read += bytes_read;
        next_read_size = calc_next_read_size(completion_condition(ec, total_bytes_read));
        if (next_read_size == 0) {
            break;
        }
    }

    return total_bytes_read;
}